

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_future_cancel(green_future_t future)

{
  int iVar1;
  
  if (future == (green_future_t)0x0) {
    iVar1 = 1;
  }
  else {
    if (future->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x29a);
      fflush(_stderr);
      abort();
    }
    if (future->state == green_future_pending) {
      future->state = green_future_aborted;
      return 0;
    }
    iVar1 = 8;
  }
  return iVar1;
}

Assistant:

int green_future_cancel(green_future_t future)
{
    // NOTE: when the async operation completes, the attempt to resolve the
    //       future will may omit to post a completion notification if it is
    //       possible to do so.  However, it's also possible that the
    //       completion notification is already in flight.  In that case, the
    //       coroutine that wakes up should also avoid to return control to
    //       application code as a result of the completion notification for a
    //       canceled future.
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);
    if (future->state != green_future_pending) {
        return GREEN_EBADFD;
    }
    future->state = green_future_aborted;
    return GREEN_SUCCESS;
}